

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O1

void __thiscall foxxll::stats::stats(stats *this)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  this->creation_time_ = (double)(lVar1 / 1000) / 1000000.0;
  (this->file_stats_list_).super__List_base<foxxll::file_stats,_std::allocator<foxxll::file_stats>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->file_stats_list_;
  (this->file_stats_list_).super__List_base<foxxll::file_stats,_std::allocator<foxxll::file_stats>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->file_stats_list_;
  (this->file_stats_list_).super__List_base<foxxll::file_stats,_std::allocator<foxxll::file_stats>_>
  ._M_impl._M_node._M_size = 0;
  (this->list_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->list_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->list_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->list_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->list_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->p_reads_ = 0.0;
  this->p_writes_ = 0.0;
  this->p_begin_read_ = 0.0;
  this->p_begin_write_ = 0.0;
  this->p_ios_ = 0.0;
  this->p_begin_io_ = 0.0;
  *(undefined8 *)((long)&this->p_begin_io_ + 4) = 0;
  this->acc_writes_ = 0;
  this->acc_ios_ = 0;
  this->t_waits_ = 0.0;
  this->p_waits_ = 0.0;
  this->p_begin_wait_ = 0.0;
  this->t_wait_read_ = 0.0;
  this->p_wait_read_ = 0.0;
  this->p_begin_wait_read_ = 0.0;
  this->t_wait_write_ = 0.0;
  this->p_wait_write_ = 0.0;
  this->p_begin_wait_write_ = 0.0;
  this->acc_waits_ = 0;
  this->acc_wait_read_ = 0;
  this->acc_wait_write_ = 0;
  memset(&this->wait_mutex_,0,0xa0);
  return;
}

Assistant:

stats::stats()
    : creation_time_(timestamp()),
      p_reads_(0.0), p_writes_(0.0),
      p_begin_read_(0.0), p_begin_write_(0.0),
      p_ios_(0.0),
      p_begin_io_(0.0),

      acc_reads_(0.0), acc_writes_(0.0),
      acc_ios_(0.0),

      t_waits_(0.0), p_waits_(0.0),
      p_begin_wait_(0.0),
      t_wait_read_(0.0), p_wait_read_(0.0),
      p_begin_wait_read_(0.0),
      t_wait_write_(0.0), p_wait_write_(0.0),
      p_begin_wait_write_(0.0),
      acc_waits_(0.0),
      acc_wait_read_(0.0), acc_wait_write_(0.0)
{ }